

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsm-builder.cc
# Opt level: O1

uint __thiscall cnn::Cluster::sample(Cluster *this,Expression *h,ComputationGraph *cg)

{
  Tensor *pTVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  real rVar5;
  real rVar6;
  float fVar7;
  vector<float,_std::allocator<float>_> dist;
  undefined1 local_60 [40];
  ComputationGraph *local_38;
  uint local_30;
  ComputationGraph *local_28;
  uint local_20;
  
  if (this->output_size == 1) {
    uVar4 = 0;
  }
  else if (this->output_size == 2) {
    local_28 = h->pg;
    local_20 = (h->i).t;
    predict((Cluster *)local_60,(Expression *)this,(ComputationGraph *)&stack0xffffffffffffffd8);
    expr::logistic((expr *)(local_60 + 0x18),(Expression *)local_60);
    pTVar1 = ComputationGraph::incremental_forward(cg);
    rVar5 = as_scalar(pTVar1);
    rVar6 = rand01();
    uVar4 = (uint)(rVar5 <= rVar6);
  }
  else {
    local_38 = h->pg;
    local_30 = (h->i).t;
    predict((Cluster *)local_60,(Expression *)this,(ComputationGraph *)&local_38);
    expr::softmax((expr *)(local_60 + 0x18),(Expression *)local_60);
    pTVar1 = ComputationGraph::incremental_forward(cg);
    as_vector((vector<float,_std::allocator<float>_> *)local_60,pTVar1);
    fVar7 = rand01();
    uVar2 = (long)(local_60._8_8_ - local_60._0_8_) >> 2;
    if (local_60._8_8_ == local_60._0_8_) {
      uVar4 = 0;
      uVar3 = 0;
    }
    else {
      uVar3 = 0;
      do {
        uVar4 = (uint)uVar3;
        fVar7 = fVar7 - *(float *)(local_60._0_8_ + uVar3 * 4);
        if (fVar7 < 0.0) break;
        uVar4 = uVar4 + 1;
        uVar3 = (ulong)uVar4;
      } while (uVar3 < uVar2);
    }
    if ((pointer)local_60._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_60._0_8_);
    }
    uVar4 = uVar4 - (uVar2 == uVar3);
  }
  return uVar4;
}

Assistant:

unsigned Cluster::sample(expr::Expression h, ComputationGraph& cg) const {
  if (output_size == 1) {
    return 0;
  }
  else if (output_size == 2) {
    logistic(predict(h, cg));
    double prob0 = as_scalar(cg.incremental_forward());
    double p = rand01();
    if (p < prob0) {
      return 0;
    }
    else {
      return 1;
    }
  }
  else {
    softmax(predict(h, cg));
    vector<float> dist = as_vector(cg.incremental_forward());
    unsigned c = 0;
    double p = rand01();
    for (; c < dist.size(); ++c) {
      p -= dist[c];
      if (p < 0.0) { break; }
    }
    if (c == dist.size()) {
      --c;
    }
    return c;
  }
}